

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,int,duckdb::UnaryOperatorWrapper,duckdb::ErrorOperator>
               (string_t *ldata,int *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  ulong uVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  InvalidInputException *pIVar8;
  ulong uVar9;
  ulong uVar10;
  char **ppcVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  string local_68;
  undefined8 local_40;
  char *local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar9 = *(ulong *)&ldata->value;
      pcVar14 = (ldata->value).pointer.ptr;
      local_40 = uVar9;
      local_38 = pcVar14;
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      if ((uint)uVar9 < 0xd) {
        pcVar14 = (char *)((long)&local_40 + 4);
      }
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,pcVar14,pcVar14 + (uVar9 & 0xffffffff));
      InvalidInputException::InvalidInputException(pIVar8,&local_68);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_40 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_68,(unsigned_long **)mask,&local_40);
      sVar5 = local_68._M_string_length;
      _Var4._M_p = local_68._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var4._M_p;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
      }
      pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar7->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      uVar10 = 0;
      uVar9 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar12 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar12 = count;
          }
LAB_013ea5f8:
          uVar6 = uVar10;
          if (uVar10 < uVar12) {
            uVar9 = *(ulong *)&ldata[uVar10].value;
            pcVar14 = ldata[uVar10].value.pointer.ptr;
            local_40 = uVar9;
            local_38 = pcVar14;
            pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            if ((uint)uVar9 < 0xd) {
              pcVar14 = (char *)((long)&local_40 + 4);
            }
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,pcVar14,pcVar14 + (uVar9 & 0xffffffff));
            InvalidInputException::InvalidInputException(pIVar8,&local_68);
            __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
        }
        else {
          uVar3 = puVar2[uVar9];
          uVar12 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar12 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_013ea5f8;
          uVar6 = uVar12;
          if ((uVar3 != 0) && (uVar6 = uVar10, uVar10 < uVar12)) {
            ppcVar11 = &ldata[uVar10].value.pointer.ptr;
            uVar13 = 0;
            do {
              if ((uVar3 >> (uVar13 & 0x3f) & 1) != 0) {
                paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar11 + -1);
                uVar9._0_4_ = paVar1->length;
                uVar9._4_1_ = paVar1->prefix[0];
                uVar9._5_1_ = paVar1->prefix[1];
                uVar9._6_1_ = paVar1->prefix[2];
                uVar9._7_1_ = paVar1->prefix[3];
                pcVar14 = *ppcVar11;
                local_40 = uVar9;
                local_38 = pcVar14;
                pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                if ((uint)(undefined4)uVar9 < 0xd) {
                  pcVar14 = (char *)((long)&local_40 + 4);
                }
                local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_68,pcVar14,pcVar14 + (uVar9 & 0xffffffff));
                InvalidInputException::InvalidInputException(pIVar8,&local_68);
                __cxa_throw(pIVar8,&InvalidInputException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              ppcVar11 = ppcVar11 + 2;
              uVar13 = uVar13 + 1;
              uVar6 = uVar12;
            } while (uVar12 - uVar10 != uVar13);
          }
        }
        uVar10 = uVar6;
        uVar9 = uVar9 + 1;
      } while (uVar9 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}